

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O3

Gia_Man_t * Gia_ManInsertWin(Gia_Man_t *p,Vec_Int_t *vOuts,Gia_Man_t *pWin)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  int iVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Man_t *pGVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  Vec_Int_t *vPis;
  Vec_Int_t *vPos;
  Vec_Int_t *vAnds;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  pcVar10 = (char *)0x0;
  Gia_ManPrepareWin(p,vOuts,&local_50,&local_48,&local_38,0);
  p_00 = Gia_ManStart((p->nObjs - local_38->nSize) + pWin->nObjs +
                      ~(pWin->vCos->nSize + pWin->vCis->nSize));
  pcVar3 = p->pName;
  if (pcVar3 != (char *)0x0) {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pName = pcVar10;
  pcVar3 = p->pSpec;
  local_40 = local_38;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      iVar8 = pVVar12->pArray[lVar14];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_0070d1a9;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_0070d1c8:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_0070d1c8;
      pGVar4[iVar8].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar12 = p->vCis;
    } while (lVar14 < pVVar12->nSize);
  }
  pGVar4 = pWin->pObjs;
  pGVar4->Value = 0;
  lVar14 = (long)pWin->vCis->nSize;
  if (0 < lVar14) {
    piVar7 = pWin->vCis->pArray;
    lVar16 = 0;
    do {
      iVar8 = piVar7[lVar16];
      if (((long)iVar8 < 0) || (pWin->nObjs <= iVar8)) goto LAB_0070d1a9;
      if (local_50->nSize <= lVar16) goto LAB_0070d206;
      iVar1 = local_50->pArray[lVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0070d1a9;
      pGVar4[iVar8].Value = p->pObjs[iVar1].Value;
      lVar16 = lVar16 + 1;
    } while (lVar14 != lVar16);
  }
  Gia_ManHashAlloc(p_00);
  iVar8 = pWin->nObjs;
  if (0 < iVar8) {
    lVar14 = 8;
    lVar16 = 0;
    do {
      pGVar4 = pWin->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar5 = *(ulong *)((long)pGVar4 + lVar14 + -8);
      if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar5) {
        uVar2 = *(uint *)((long)pGVar4 + lVar14 + (ulong)(uint)((int)(uVar5 & 0x1fffffff) << 2) * -3
                         );
        if (((int)uVar2 < 0) ||
           (uVar15 = *(uint *)((long)pGVar4 +
                              lVar14 + (ulong)((uint)(uVar5 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar15 < 0)) goto LAB_0070d1e7;
        iVar8 = Gia_ManHashAnd(p_00,uVar2 ^ (uint)(uVar5 >> 0x1d) & 1,
                               uVar15 ^ (uint)(uVar5 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar14) = iVar8;
        iVar8 = pWin->nObjs;
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar16 < iVar8);
  }
  lVar14 = (long)pWin->vCos->nSize;
  if (0 < lVar14) {
    piVar7 = pWin->vCos->pArray;
    lVar16 = 0;
    do {
      iVar1 = piVar7[lVar16];
      if (((long)iVar1 < 0) || (iVar8 <= iVar1)) goto LAB_0070d1a9;
      if (pWin->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pWin->pObjs + iVar1;
      uVar15 = (uint)*(undefined8 *)pGVar4;
      uVar2 = pGVar4[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar2 < 0) goto LAB_0070d1e7;
      if (local_48->nSize <= lVar16) {
LAB_0070d206:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = local_48->pArray[lVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0070d1a9;
      p->pObjs[iVar1].Value = uVar15 >> 0x1d & 1 ^ uVar2;
      lVar16 = lVar16 + 1;
    } while (lVar14 != lVar16);
  }
  iVar8 = p->nObjs;
  if (0 < iVar8) {
    lVar14 = 8;
    lVar16 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar5 = *(ulong *)((long)pGVar4 + lVar14 + -8);
      if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar5) {
        if (p->nTravIdsAlloc <= lVar16) {
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
        }
        if (p->pTravIds[lVar16] != p->nTravIds) {
          uVar2 = *(uint *)((long)pGVar4 +
                           lVar14 + (ulong)(uint)((int)(uVar5 & 0x1fffffff) << 2) * -3);
          if (((int)uVar2 < 0) ||
             (uVar15 = *(uint *)((long)pGVar4 +
                                lVar14 + (ulong)((uint)(uVar5 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar15 < 0)) goto LAB_0070d1e7;
          iVar8 = Gia_ManHashAnd(p_00,uVar2 ^ (uint)(uVar5 >> 0x1d) & 1,
                                 uVar15 ^ (uint)(uVar5 >> 0x3d) & 1);
          *(int *)(&pGVar4->field_0x0 + lVar14) = iVar8;
          iVar8 = p->nObjs;
        }
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar16 < iVar8);
  }
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      iVar8 = pVVar12->pArray[lVar14];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_0070d1a9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar8;
      uVar15 = (uint)*(undefined8 *)pGVar4;
      uVar2 = pGVar4[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar2 < 0) {
LAB_0070d1e7:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar2);
      lVar14 = lVar14 + 1;
      pVVar12 = p->vCos;
    } while (lVar14 < pVVar12->nSize);
  }
  Gia_ManHashStop(p_00);
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
  }
  free(local_50);
  pVVar12 = local_40;
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
  }
  free(local_48);
  piVar7 = pVVar12->pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar12);
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar13;
}

Assistant:

Gia_Man_t * Gia_ManInsertWin( Gia_Man_t * p, Vec_Int_t * vOuts, Gia_Man_t * pWin )
{
    Vec_Int_t * vPos, * vPis, * vAnds;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManPrepareWin( p, vOuts, &vPis, &vPos, &vAnds, 0 );
    // create AIG
    pNew = Gia_ManStart( Gia_ManObjNum(p) - Vec_IntSize(vAnds) + Gia_ManAndNum(pWin) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // inputs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManConst0(pWin)->Value = 0;
    Gia_ManForEachCi( pWin, pObj, i )
        pObj->Value = Gia_ManObj(p, Vec_IntEntry(vPis, i))->Value;
    // internal nodes
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( pWin, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pWin, pObj, i )
        Gia_ManObj( p, Vec_IntEntry(vPos, i) )->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachAnd( p, pObj, i )
        if ( !Gia_ObjIsTravIdCurrentId(p, i) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    // cleanup
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vAnds );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}